

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftp.c
# Opt level: O2

CURLcode ftp_parse_url_path(connectdata *conn)

{
  anon_union_208_8_f709340f_for_proto *ftpc;
  int *piVar1;
  curl_ftpfile cVar2;
  SessionHandle *data;
  char *pcVar3;
  _Bool _Var4;
  int iVar5;
  int iVar6;
  size_t sVar7;
  char **ppcVar8;
  char *pcVar9;
  char *pcVar10;
  FTP *pFVar11;
  CURLcode CVar12;
  SessionHandle *pSVar13;
  ulong uVar14;
  int dlen;
  FTP *local_38;
  
  data = conn->data;
  pcVar10 = (data->state).path;
  pFVar11 = (data->state).proto.ftp;
  ftpc = &conn->proto;
  (conn->proto).ftpc.ctl_valid = false;
  (conn->proto).ftpc.cwdfail = false;
  cVar2 = (data->set).ftp_filemethod;
  if (cVar2 == FTPFILE_SINGLECWD) {
    if (*pcVar10 == '\0') {
      (conn->proto).ftpc.dirdepth = 0;
      goto LAB_00117313;
    }
    local_38 = pFVar11;
    pcVar9 = strrchr(pcVar10,0x2f);
    pSVar13 = data;
    if (pcVar9 == (char *)0x0) goto LAB_00117344;
    ppcVar8 = (char **)(*Curl_ccalloc)(1,8);
    (conn->proto).ftpc.dirs = ppcVar8;
    if (ppcVar8 == (char **)0x0) {
      return CURLE_OUT_OF_MEMORY;
    }
    pSVar13 = conn->data;
    iVar5 = curlx_sztosi((long)pcVar9 - (long)pcVar10);
    pcVar10 = curl_easy_unescape(pSVar13,pcVar10,iVar5,(int *)0x0);
    *(conn->proto).ftpc.dirs = pcVar10;
    if (*(conn->proto).ftpc.dirs != (char *)0x0) {
      (conn->proto).ftpc.dirdepth = 1;
      goto LAB_001172fb;
    }
LAB_0011755b:
    CVar12 = CURLE_OUT_OF_MEMORY;
    freedirs(&ftpc->ftpc);
  }
  else {
    if (cVar2 == FTPFILE_NOCWD) {
      if (((pcVar10 == (char *)0x0) || (*pcVar10 == '\0')) ||
         (sVar7 = strlen(pcVar10), pcVar10[sVar7 - 1] == '/')) goto LAB_00117313;
    }
    else {
      (conn->proto).imapc.idstr = (char *)0x500000000;
      local_38 = pFVar11;
      ppcVar8 = (char **)(*Curl_ccalloc)(5,8);
      (conn->proto).ftpc.dirs = ppcVar8;
      if (ppcVar8 == (char **)0x0) {
        return CURLE_OUT_OF_MEMORY;
      }
      iVar5 = curl_strequal(pcVar10,"/");
      if (iVar5 == 0) {
        while (pcVar9 = strchr(pcVar10,0x2f), pcVar9 != (char *)0x0) {
          pcVar3 = (data->state).path;
          uVar14 = 0;
          if (pcVar10 != pcVar3 && -1 < (long)pcVar10 - (long)pcVar3) {
            uVar14 = (ulong)((conn->proto).ftpc.dirdepth == 0);
          }
          if ((long)pcVar9 - (long)pcVar10 != 0) {
            iVar5 = curlx_sztosi(((long)pcVar9 - (long)pcVar10) + uVar14);
            pcVar10 = curl_easy_unescape(conn->data,pcVar10 + -uVar14,iVar5,(int *)0x0);
            iVar5 = (conn->proto).ftpc.dirdepth;
            (conn->proto).ftpc.dirs[iVar5] = pcVar10;
            ppcVar8 = (conn->proto).ftpc.dirs;
            pcVar10 = ppcVar8[iVar5];
            if (pcVar10 == (char *)0x0) {
              Curl_failf(data,"no memory");
LAB_00117582:
              freedirs(&ftpc->ftpc);
              return CURLE_OUT_OF_MEMORY;
            }
            _Var4 = isBadFtpString(pcVar10);
            if (_Var4) {
              (*Curl_cfree)(pcVar10);
              goto LAB_0011736f;
            }
            (conn->proto).ftpc.dirdepth = iVar5 + 1;
            iVar6 = (conn->proto).ftpc.diralloc;
            if (iVar6 <= iVar5 + 1) {
              (conn->proto).ftpc.diralloc = iVar6 * 2;
              ppcVar8 = (char **)(*Curl_crealloc)(ppcVar8,(long)iVar6 << 4);
              if (ppcVar8 == (char **)0x0) goto LAB_00117582;
              (conn->proto).ftpc.dirs = ppcVar8;
            }
          }
          pcVar10 = pcVar9 + 1;
        }
        pFVar11 = local_38;
        if (pcVar10 == (char *)0x0) goto LAB_00117313;
      }
      else {
        pcVar9 = (*Curl_cstrdup)("/");
        *(conn->proto).ftpc.dirs = pcVar9;
        piVar1 = &(conn->proto).ftpc.dirdepth;
        *piVar1 = *piVar1 + 1;
        pcVar9 = pcVar10;
LAB_001172fb:
        pcVar10 = pcVar9 + 1;
        pFVar11 = local_38;
      }
    }
    if (*pcVar10 == '\0') {
LAB_00117313:
      (conn->proto).ftpc.file = (char *)0x0;
      if (((data->set).upload != true) || (pFVar11->transfer != FTPTRANSFER_BODY))
      goto LAB_0011737c;
      Curl_failf(data,"Uploading to a URL without a file name!");
    }
    else {
      pSVar13 = conn->data;
LAB_00117344:
      pcVar10 = curl_easy_unescape(pSVar13,pcVar10,0,(int *)0x0);
      (conn->proto).ftpc.file = pcVar10;
      if (pcVar10 == (char *)0x0) {
        freedirs(&ftpc->ftpc);
        Curl_failf(data,"no memory");
        return CURLE_OUT_OF_MEMORY;
      }
      _Var4 = isBadFtpString(pcVar10);
      if (!_Var4) {
LAB_0011737c:
        (conn->proto).ftpc.cwddone = false;
        if ((conn->proto).ftpc.prevpath == (char *)0x0) {
          return CURLE_OK;
        }
        iVar5 = 0;
        pcVar10 = curl_easy_unescape(conn->data,(data->state).path,0,&dlen);
        if (pcVar10 != (char *)0x0) {
          pcVar9 = (conn->proto).ftpc.file;
          if (pcVar9 != (char *)0x0) {
            sVar7 = strlen(pcVar9);
            iVar5 = curlx_uztosi(sVar7);
          }
          iVar5 = dlen - iVar5;
          dlen = iVar5;
          sVar7 = strlen((conn->proto).ftpc.prevpath);
          iVar6 = curlx_uztosi(sVar7);
          if ((iVar5 == iVar6) &&
             (iVar5 = curl_strnequal(pcVar10,(conn->proto).ftpc.prevpath,(long)dlen), iVar5 != 0)) {
            Curl_infof(data,"Request has same path as previous transfer\n");
            (conn->proto).ftpc.cwddone = true;
          }
          (*Curl_cfree)(pcVar10);
          return CURLE_OK;
        }
        goto LAB_0011755b;
      }
LAB_0011736f:
      freedirs(&ftpc->ftpc);
    }
    CVar12 = CURLE_URL_MALFORMAT;
  }
  return CVar12;
}

Assistant:

static
CURLcode ftp_parse_url_path(struct connectdata *conn)
{
  struct SessionHandle *data = conn->data;
  /* the ftp struct is already inited in ftp_connect() */
  struct FTP *ftp = data->state.proto.ftp;
  struct ftp_conn *ftpc = &conn->proto.ftpc;
  const char *slash_pos;  /* position of the first '/' char in curpos */
  const char *path_to_use = data->state.path;
  const char *cur_pos;
  const char *filename = NULL;

  cur_pos = path_to_use; /* current position in path. point at the begin
                            of next path component */

  ftpc->ctl_valid = FALSE;
  ftpc->cwdfail = FALSE;

  switch(data->set.ftp_filemethod) {
  case FTPFILE_NOCWD:
    /* fastest, but less standard-compliant */

    /*
      The best time to check whether the path is a file or directory is right
      here. so:

      the first condition in the if() right here, is there just in case
      someone decides to set path to NULL one day
   */
    if(data->state.path &&
       data->state.path[0] &&
       (data->state.path[strlen(data->state.path) - 1] != '/') )
      filename = data->state.path;  /* this is a full file path */
      /*
        ftpc->file is not used anywhere other than for operations on a file.
        In other words, never for directory operations.
        So we can safely leave filename as NULL here and use it as a
        argument in dir/file decisions.
      */
    break;

  case FTPFILE_SINGLECWD:
    /* get the last slash */
    if(!path_to_use[0]) {
      /* no dir, no file */
      ftpc->dirdepth = 0;
      break;
    }
    slash_pos=strrchr(cur_pos, '/');
    if(slash_pos || !*cur_pos) {
      ftpc->dirs = calloc(1, sizeof(ftpc->dirs[0]));
      if(!ftpc->dirs)
        return CURLE_OUT_OF_MEMORY;

      ftpc->dirs[0] = curl_easy_unescape(conn->data, slash_pos ? cur_pos : "/",
                                         slash_pos ?
                                         curlx_sztosi(slash_pos-cur_pos) : 1,
                                         NULL);
      if(!ftpc->dirs[0]) {
        freedirs(ftpc);
        return CURLE_OUT_OF_MEMORY;
      }
      ftpc->dirdepth = 1; /* we consider it to be a single dir */
      filename = slash_pos ? slash_pos+1 : cur_pos; /* rest is file name */
    }
    else
      filename = cur_pos;  /* this is a file name only */
    break;

  default: /* allow pretty much anything */
  case FTPFILE_MULTICWD:
    ftpc->dirdepth = 0;
    ftpc->diralloc = 5; /* default dir depth to allocate */
    ftpc->dirs = calloc(ftpc->diralloc, sizeof(ftpc->dirs[0]));
    if(!ftpc->dirs)
      return CURLE_OUT_OF_MEMORY;

    /* we have a special case for listing the root dir only */
    if(strequal(path_to_use, "/")) {
      cur_pos++; /* make it point to the zero byte */
      ftpc->dirs[0] = strdup("/");
      ftpc->dirdepth++;
    }
    else {
      /* parse the URL path into separate path components */
      while((slash_pos = strchr(cur_pos, '/')) != NULL) {
        /* 1 or 0 pointer offset to indicate absolute directory */
        ssize_t absolute_dir = ((cur_pos - data->state.path > 0) &&
                                (ftpc->dirdepth == 0))?1:0;

        /* seek out the next path component */
        if(slash_pos-cur_pos) {
          /* we skip empty path components, like "x//y" since the FTP command
             CWD requires a parameter and a non-existent parameter a) doesn't
             work on many servers and b) has no effect on the others. */
          int len = curlx_sztosi(slash_pos - cur_pos + absolute_dir);
          ftpc->dirs[ftpc->dirdepth] =
            curl_easy_unescape(conn->data, cur_pos - absolute_dir, len, NULL);
          if(!ftpc->dirs[ftpc->dirdepth]) { /* run out of memory ... */
            failf(data, "no memory");
            freedirs(ftpc);
            return CURLE_OUT_OF_MEMORY;
          }
          if(isBadFtpString(ftpc->dirs[ftpc->dirdepth])) {
            free(ftpc->dirs[ftpc->dirdepth]);
            freedirs(ftpc);
            return CURLE_URL_MALFORMAT;
          }
        }
        else {
          cur_pos = slash_pos + 1; /* jump to the rest of the string */
          continue;
        }

        cur_pos = slash_pos + 1; /* jump to the rest of the string */
        if(++ftpc->dirdepth >= ftpc->diralloc) {
          /* enlarge array */
          char **bigger;
          ftpc->diralloc *= 2; /* double the size each time */
          bigger = realloc(ftpc->dirs, ftpc->diralloc * sizeof(ftpc->dirs[0]));
          if(!bigger) {
            freedirs(ftpc);
            return CURLE_OUT_OF_MEMORY;
          }
          ftpc->dirs = bigger;
        }
      }
    }
    filename = cur_pos;  /* the rest is the file name */
    break;
  } /* switch */

  if(filename && *filename) {
    ftpc->file = curl_easy_unescape(conn->data, filename, 0, NULL);
    if(NULL == ftpc->file) {
      freedirs(ftpc);
      failf(data, "no memory");
      return CURLE_OUT_OF_MEMORY;
    }
    if(isBadFtpString(ftpc->file)) {
      freedirs(ftpc);
      return CURLE_URL_MALFORMAT;
    }
  }
  else
    ftpc->file=NULL; /* instead of point to a zero byte, we make it a NULL
                       pointer */

  if(data->set.upload && !ftpc->file && (ftp->transfer == FTPTRANSFER_BODY)) {
    /* We need a file name when uploading. Return error! */
    failf(data, "Uploading to a URL without a file name!");
    return CURLE_URL_MALFORMAT;
  }

  ftpc->cwddone = FALSE; /* default to not done */

  if(ftpc->prevpath) {
    /* prevpath is "raw" so we convert the input path before we compare the
       strings */
    int dlen;
    char *path = curl_easy_unescape(conn->data, data->state.path, 0, &dlen);
    if(!path) {
      freedirs(ftpc);
      return CURLE_OUT_OF_MEMORY;
    }

    dlen -= ftpc->file?curlx_uztosi(strlen(ftpc->file)):0;
    if((dlen == curlx_uztosi(strlen(ftpc->prevpath))) &&
       strnequal(path, ftpc->prevpath, dlen)) {
      infof(data, "Request has same path as previous transfer\n");
      ftpc->cwddone = TRUE;
    }
    free(path);
  }

  return CURLE_OK;
}